

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

Vec_Int_t * Gia_SweeperGetCex(Gia_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Swp_Man_t *pSwp;
  Gia_Man_t *p_local;
  
  pvVar1 = p->pData;
  if (*(long *)((long)pvVar1 + 0x50) != 0) {
    iVar2 = Vec_IntSize(*(Vec_Int_t **)((long)pvVar1 + 0x50));
    iVar3 = Gia_ManPiNum(p);
    if (iVar2 != iVar3) {
      __assert_fail("pSwp->vCexUser == NULL || Vec_IntSize(pSwp->vCexUser) == Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                    ,0xe9,"Vec_Int_t *Gia_SweeperGetCex(Gia_Man_t *)");
    }
  }
  return *(Vec_Int_t **)((long)pvVar1 + 0x50);
}

Assistant:

Vec_Int_t * Gia_SweeperGetCex( Gia_Man_t * p )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    assert( pSwp->vCexUser == NULL || Vec_IntSize(pSwp->vCexUser) == Gia_ManPiNum(p) );
    return pSwp->vCexUser;
}